

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintNestedMessages
          (Generator *this,Descriptor *containing_descriptor,string *prefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *to_register)

{
  int iVar1;
  Descriptor *message_descriptor;
  int local_2c;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *to_register_local;
  string *prefix_local;
  Descriptor *containing_descriptor_local;
  Generator *this_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(containing_descriptor);
    if (iVar1 <= local_2c) break;
    io::Printer::Print(this->printer_,"\n");
    message_descriptor = Descriptor::nested_type(containing_descriptor,local_2c);
    PrintMessage(this,message_descriptor,prefix,to_register);
    io::Printer::Print(this->printer_,",\n");
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Generator::PrintNestedMessages(const Descriptor& containing_descriptor,
                                    const string& prefix,
                                    std::vector<string>* to_register) const {
  for (int i = 0; i < containing_descriptor.nested_type_count(); ++i) {
    printer_->Print("\n");
    PrintMessage(*containing_descriptor.nested_type(i), prefix, to_register);
    printer_->Print(",\n");
  }
}